

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.h
# Opt level: O3

void __thiscall icu_63::UVector32::addElement(UVector32 *this,int32_t elem,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  
  iVar2 = this->count;
  if ((iVar2 < -1) || (this->capacity <= iVar2)) {
    UVar1 = expandCapacity(this,iVar2 + 1,status);
    if (UVar1 == '\0') {
      return;
    }
    iVar2 = this->count;
  }
  this->elements[iVar2] = elem;
  this->count = this->count + 1;
  return;
}

Assistant:

inline void UVector32::addElement(int32_t elem, UErrorCode &status) {
    if (ensureCapacity(count + 1, status)) {
        elements[count] = elem;
        count++;
    }
}